

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

smap * units::loadDefinedMeasurementTypes_abi_cxx11_(void)

{
  const_iterator pvVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>,_bool>
  pVar2;
  value_type *pr;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_units::precise_unit>,_247UL> *__range1;
  smap *knownMeasurementTypes;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  in_stack_ffffffffffffff98;
  const_iterator local_20;
  
  memset(in_RDI,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                   *)0x6c0071);
  local_20 = std::array<std::pair<const_char_*,_units::precise_unit>,_247UL>::begin
                       ((array<std::pair<const_char_*,_units::precise_unit>,_247UL> *)0x6c0089);
  pvVar1 = std::array<std::pair<const_char_*,_units::precise_unit>,_247UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_247UL> *)0x6c009a);
  for (; local_20 != pvVar1; local_20 = local_20 + 1) {
    if (local_20->first != (char *)0x0) {
      pVar2 = std::
              unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
              ::emplace<char_const*const&,units::precise_unit_const&>
                        (in_RDI,(char **)in_stack_ffffffffffffff98._M_cur,
                         (precise_unit *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffff98._M_cur =
           (__node_type *)
           pVar2.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
           ._M_cur;
      in_stack_ffffffffffffff97 = pVar2.second;
    }
  }
  return in_RDI;
}

Assistant:

static smap loadDefinedMeasurementTypes()
{
    smap knownMeasurementTypes{};
    for (const auto& pr : defined_measurement_types) {
        if (pr.first != nullptr) {
            knownMeasurementTypes.emplace(pr.first, pr.second);
        }
    }
    return knownMeasurementTypes;
}